

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O1

void blake256_final_h(state_conflict *S,uint8_t *digest,uint8_t pa,uint8_t pb)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint8_t msglen [8];
  uint8_t local_1a;
  uint8_t local_19;
  uint8_t local_18;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  
  uVar1 = S->t[0];
  uVar2 = S->buflen;
  iVar4 = uVar2 + uVar1;
  iVar3 = S->t[1] + (uint)CARRY4(uVar2,uVar1);
  local_18 = (uint8_t)((uint)iVar3 >> 0x18);
  local_17 = (undefined1)((uint)iVar3 >> 0x10);
  local_16 = (undefined1)((uint)iVar3 >> 8);
  local_15 = (undefined1)iVar3;
  local_14 = (undefined1)((uint)iVar4 >> 0x18);
  local_13 = (undefined1)((uint)iVar4 >> 0x10);
  local_12 = (undefined1)((uint)iVar4 >> 8);
  local_11 = (undefined1)iVar4;
  local_1a = pb;
  local_19 = pa;
  if ((long)(int)uVar2 == 0x1b8) {
    S->t[0] = uVar1 - 8;
    blake256_update(S,&local_19,8);
  }
  else {
    if ((int)uVar2 < 0x1b8) {
      if (uVar2 == 0) {
        S->nullt = 1;
      }
      S->t[0] = (uVar2 + uVar1) - 0x1b8;
      blake256_update(S,padding,0x1b8 - (long)(int)uVar2);
    }
    else {
      S->t[0] = (uVar2 + uVar1) - 0x200;
      blake256_update(S,padding,(long)(int)(0x200 - uVar2));
      S->t[0] = S->t[0] - 0x1b8;
      blake256_update(S,padding + 1,0x1b8);
      S->nullt = 1;
    }
    blake256_update(S,&local_1a,8);
    S->t[0] = S->t[0] - 8;
  }
  S->t[0] = S->t[0] - 0x40;
  blake256_update(S,&local_18,0x40);
  *digest = *(uint8_t *)((long)S->h + 3);
  digest[1] = *(uint8_t *)((long)S->h + 2);
  digest[2] = *(uint8_t *)((long)S->h + 1);
  digest[3] = (uint8_t)S->h[0];
  digest[4] = *(uint8_t *)((long)S->h + 7);
  digest[5] = *(uint8_t *)((long)S->h + 6);
  digest[6] = *(uint8_t *)((long)S->h + 5);
  digest[7] = (uint8_t)S->h[1];
  digest[8] = *(uint8_t *)((long)S->h + 0xb);
  digest[9] = *(uint8_t *)((long)S->h + 10);
  digest[10] = *(uint8_t *)((long)S->h + 9);
  digest[0xb] = (uint8_t)S->h[2];
  digest[0xc] = *(uint8_t *)((long)S->h + 0xf);
  digest[0xd] = *(uint8_t *)((long)S->h + 0xe);
  digest[0xe] = *(uint8_t *)((long)S->h + 0xd);
  digest[0xf] = (uint8_t)S->h[3];
  digest[0x10] = *(uint8_t *)((long)S->h + 0x13);
  digest[0x11] = *(uint8_t *)((long)S->h + 0x12);
  digest[0x12] = *(uint8_t *)((long)S->h + 0x11);
  digest[0x13] = (uint8_t)S->h[4];
  digest[0x14] = *(uint8_t *)((long)S->h + 0x17);
  digest[0x15] = *(uint8_t *)((long)S->h + 0x16);
  digest[0x16] = *(uint8_t *)((long)S->h + 0x15);
  digest[0x17] = (uint8_t)S->h[5];
  digest[0x18] = *(uint8_t *)((long)S->h + 0x1b);
  digest[0x19] = *(uint8_t *)((long)S->h + 0x1a);
  digest[0x1a] = *(uint8_t *)((long)S->h + 0x19);
  digest[0x1b] = (uint8_t)S->h[6];
  digest[0x1c] = *(uint8_t *)((long)S->h + 0x1f);
  digest[0x1d] = *(uint8_t *)((long)S->h + 0x1e);
  digest[0x1e] = *(uint8_t *)((long)S->h + 0x1d);
  digest[0x1f] = (uint8_t)S->h[7];
  return;
}

Assistant:

void blake256_final_h(state *S, uint8_t *digest, uint8_t pa, uint8_t pb) {
    uint8_t msglen[8];
    uint32_t lo = S->t[0] + S->buflen, hi = S->t[1];
    if (lo < (unsigned) S->buflen) hi++;
    U32TO8(msglen + 0, hi);
    U32TO8(msglen + 4, lo);

    if (S->buflen == 440) { /* one padding byte */
        S->t[0] -= 8;
        blake256_update(S, &pa, 8);
    } else {
        if (S->buflen < 440) { /* enough space to fill the block  */
            if (S->buflen == 0) S->nullt = 1;
            S->t[0] -= 440 - S->buflen;
            blake256_update(S, padding, 440 - S->buflen);
        } else { /* need 2 compressions */
            S->t[0] -= 512 - S->buflen;
            blake256_update(S, padding, 512 - S->buflen);
            S->t[0] -= 440;
            blake256_update(S, padding + 1, 440);
            S->nullt = 1;
        }
        blake256_update(S, &pb, 8);
        S->t[0] -= 8;
    }
    S->t[0] -= 64;
    blake256_update(S, msglen, 64);

    U32TO8(digest +  0, S->h[0]);
    U32TO8(digest +  4, S->h[1]);
    U32TO8(digest +  8, S->h[2]);
    U32TO8(digest + 12, S->h[3]);
    U32TO8(digest + 16, S->h[4]);
    U32TO8(digest + 20, S->h[5]);
    U32TO8(digest + 24, S->h[6]);
    U32TO8(digest + 28, S->h[7]);
}